

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O2

ostream * despot::operator<<(ostream *os,Variable *var)

{
  uint uVar1;
  ostream *poVar2;
  
  std::operator<<(os,"Values:");
  for (uVar1 = 0;
      (ulong)uVar1 <
      (ulong)((long)(var->values_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(var->values_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5); uVar1 = uVar1 + 1) {
    poVar2 = std::operator<<(os," ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    poVar2 = std::operator<<(poVar2,"=");
    std::operator<<(poVar2,(string *)
                           ((var->values_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar1));
  }
  std::endl<char,std::char_traits<char>>(os);
  return os;
}

Assistant:

ostream& operator<<(ostream& os, const Variable& var) {
	os << "Values:";
	for (unsigned int i = 0; i < var.values_.size(); i++) {
		os << " " << i << "=" << var.values_[i];
	}
	os << endl;
	return os;
}